

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int secp_key_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,ptls_iovec_t *secret,
                     ptls_iovec_t peerkey)

{
  bool bVar1;
  int iVar2;
  EC_GROUP *group;
  BN_CTX *bn_ctx;
  EC_POINT *pub_key;
  EC_KEY *key;
  EC_POINT *point;
  uint8_t *out;
  int iVar3;
  size_t __size;
  ptls_iovec_t pVar4;
  
  group = EC_GROUP_new_by_curve_name((int)algo->data);
  if (group == (EC_GROUP *)0x0) {
    return 0x203;
  }
  bn_ctx = BN_CTX_new();
  if (bn_ctx == (BN_CTX *)0x0) {
    iVar3 = 0x201;
    goto LAB_00122eb3;
  }
  pubkey->base = (uint8_t *)0x0;
  pubkey->len = 0;
  secret->base = (uint8_t *)0x0;
  secret->len = 0;
  pub_key = x9_62_decode_point((EC_GROUP *)group,peerkey,(BN_CTX *)bn_ctx);
  if (pub_key == (EC_POINT *)0x0) {
    iVar3 = 0x32;
LAB_00122e8d:
    free(pubkey->base);
    pubkey->base = (uint8_t *)0x0;
    pubkey->len = 0;
    free(secret->base);
    secret->base = (uint8_t *)0x0;
    secret->len = 0;
  }
  else {
    key = ecdh_gerenate_key((EC_GROUP *)group);
    iVar3 = 0x201;
    if (key == (EC_KEY *)0x0) {
LAB_00122e61:
      bVar1 = false;
    }
    else {
      point = EC_KEY_get0_public_key((EC_KEY *)key);
      pVar4 = x9_62_encode_point((EC_GROUP *)group,(EC_POINT *)point,(BN_CTX *)bn_ctx);
      *pubkey = pVar4;
      if (pVar4.base == (uint8_t *)0x0) goto LAB_00122e61;
      iVar2 = EC_GROUP_get_degree(group);
      __size = (size_t)((iVar2 + 7) / 8);
      secret->len = __size;
      out = (uint8_t *)malloc(__size);
      secret->base = out;
      if (out == (uint8_t *)0x0) goto LAB_00122e61;
      iVar2 = ECDH_compute_key(out,__size,(EC_POINT *)pub_key,(EC_KEY *)key,(KDF *)0x0);
      iVar3 = 0x28;
      if (0 < iVar2) {
        iVar3 = 0;
      }
      bVar1 = 0 < iVar2;
    }
    EC_POINT_free((EC_POINT *)pub_key);
    if (key != (EC_KEY *)0x0) {
      EC_KEY_free((EC_KEY *)key);
    }
    if (!bVar1) goto LAB_00122e8d;
  }
  BN_CTX_free(bn_ctx);
LAB_00122eb3:
  EC_GROUP_free(group);
  return iVar3;
}

Assistant:

static int secp_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    EC_GROUP *group = NULL;
    BN_CTX *bn_ctx = NULL;
    int ret;

    if ((group = EC_GROUP_new_by_curve_name((int)algo->data)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((bn_ctx = BN_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = x9_62_key_exchange(group, pubkey, secret, peerkey, bn_ctx);

Exit:
    if (bn_ctx != NULL)
        BN_CTX_free(bn_ctx);
    if (group != NULL)
        EC_GROUP_free(group);
    return ret;
}